

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_libc.c
# Opt level: O3

err_t OpenDir(filestream *p,tchar_t *Path,int Flags)

{
  DIR *pDVar1;
  int *piVar2;
  err_t eVar3;
  char *__name;
  
  if ((DIR *)p->FindDir != (DIR *)0x0) {
    closedir((DIR *)p->FindDir);
  }
  __name = "/";
  if (*Path != '\0') {
    __name = Path;
  }
  pDVar1 = opendir(__name);
  p->FindDir = (DIR *)pDVar1;
  if (pDVar1 == (DIR *)0x0) {
    piVar2 = __errno_location();
    eVar3 = -8;
    if (*piVar2 == 0x14) {
      eVar3 = -0xe;
    }
  }
  else {
    tcscpy_s(p->DirPath,0x100,__name);
    AddPathDelimiter(p->DirPath,0x100);
    eVar3 = 0;
  }
  return eVar3;
}

Assistant:

static err_t OpenDir(filestream* p,const tchar_t* Path,int UNUSED_PARAM(Flags))
{
    if (p->FindDir)
        closedir(p->FindDir);

    if (Path[0]==0)
        Path = T("/");

    p->FindDir = opendir(Path);
    if (!p->FindDir)
    {
        if (errno == ENOTDIR)
            return ERR_NOT_DIRECTORY;
        else
            return ERR_FILE_NOT_FOUND;
    }

    tcscpy_s(p->DirPath,TSIZEOF(p->DirPath),Path);
    AddPathDelimiter(p->DirPath,TSIZEOF(p->DirPath));
    return ERR_NONE;
}